

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O2

int __thiscall Server::close(Server *this,int __fd)

{
  __shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  bool bVar2;
  int iVar3;
  long lVar4;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  _Var5;
  long lVar6;
  const_iterator __first;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  __it;
  int *local_58;
  int local_4c;
  pthread_mutex_t *local_48;
  vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_> *local_40;
  int *local_38;
  
  local_48 = (pthread_mutex_t *)&this->_staleFileDescriptorsMutex;
  local_4c = __fd;
  std::mutex::lock((mutex *)&local_48->__data);
  local_40 = &this->_clientSockets;
  __it._M_current =
       (this->_clientSockets).
       super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = &((this->_clientSockets).
             super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>;
  lVar4 = (long)p_Var1 - (long)__it._M_current;
  local_58 = &local_4c;
  local_38 = &local_4c;
  for (lVar6 = lVar4 >> 6; _Var5._M_current = __it._M_current, 0 < lVar6; lVar6 = lVar6 + -1) {
    bVar2 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                      ((_Iter_pred<Server::close(int)::__0> *)&local_58,__it);
    if (bVar2) goto LAB_0010cb8e;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                      ((_Iter_pred<Server::close(int)::__0> *)&local_58,__it._M_current + 1);
    _Var5._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_0010cb8e;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                      ((_Iter_pred<Server::close(int)::__0> *)&local_58,__it._M_current + 2);
    _Var5._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_0010cb8e;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                      ((_Iter_pred<Server::close(int)::__0> *)&local_58,__it._M_current + 3);
    _Var5._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_0010cb8e;
    __it._M_current = __it._M_current + 4;
    lVar4 = lVar4 + -0x40;
  }
  lVar4 = lVar4 >> 4;
  if (lVar4 == 1) {
LAB_0010cc28:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                      ((_Iter_pred<Server::close(int)::__0> *)&local_58,__it);
    _Var5._M_current = __it._M_current;
    if (!bVar2) {
      _Var5._M_current = (shared_ptr<ClientSocket> *)p_Var1;
    }
  }
  else if (lVar4 == 2) {
LAB_0010cc0c:
    bVar2 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                      ((_Iter_pred<Server::close(int)::__0> *)&local_58,__it);
    _Var5._M_current = __it._M_current;
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0010cc28;
    }
  }
  else {
    __first._M_current = (shared_ptr<ClientSocket> *)p_Var1;
    if (lVar4 != 3) goto LAB_0010cbcc;
    bVar2 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                      ((_Iter_pred<Server::close(int)::__0> *)&local_58,__it);
    if (!bVar2) {
      __it._M_current = __it._M_current + 1;
      goto LAB_0010cc0c;
    }
  }
LAB_0010cb8e:
  __first._M_current = _Var5._M_current;
  if (&(_Var5._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2> != p_Var1) {
    while (_Var5._M_current =
                (shared_ptr<ClientSocket> *)
                (&(_Var5._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2> +
                1), (__shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2> *)_Var5._M_current !=
                    p_Var1) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<Server::close(int)::$_0>::operator()
                        ((_Iter_pred<Server::close(int)::__0> *)&local_38,_Var5);
      if (!bVar2) {
        std::__shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(__first._M_current)->
                    super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2>,
                   (__shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2> *)_Var5._M_current);
        __first._M_current =
             (shared_ptr<ClientSocket> *)
             (&(__first._M_current)->super___shared_ptr<ClientSocket,_(__gnu_cxx::_Lock_policy)2> +
             1);
      }
    }
  }
LAB_0010cbcc:
  std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::erase
            (local_40,__first,
             (this->_clientSockets).
             super__Vector_base<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  std::vector<int,_std::allocator<int>_>::push_back(&this->_staleFileDescriptors,&local_4c);
  iVar3 = pthread_mutex_unlock(local_48);
  return iVar3;
}

Assistant:

void Server::close( int fileDescriptor )
{
  std::lock_guard<std::mutex> lock( _staleFileDescriptorsMutex );

  _clientSockets.erase( std::remove_if( _clientSockets.begin(), _clientSockets.end(),
                                        [&] ( std::shared_ptr<ClientSocket> socket )
                                        {
                                          return socket->fileDescriptor() == fileDescriptor;
                                        } ),
                                        _clientSockets.end() );

  _staleFileDescriptors.push_back( fileDescriptor );
}